

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lock.cpp
# Opt level: O0

bool __thiscall Threading::MutexLock::_Lock(MutexLock *this,TimeOut *rcxTO)

{
  bool bVar1;
  uint32 uVar2;
  uint32 uVar3;
  int iVar4;
  int local_34;
  undefined1 auStack_30 [4];
  int retval;
  timeval tOut;
  TimeOut *rcxTO_local;
  MutexLock *this_local;
  
  tOut.tv_usec = (__suseconds_t)rcxTO;
  uVar2 = TimeOut::operator_cast_to_unsigned_int(rcxTO);
  uVar3 = TimeOut::operator_cast_to_unsigned_int((TimeOut *)&Infinite);
  if (uVar2 == uVar3) {
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)this);
    this_local._7_1_ = iVar4 == 0;
  }
  else {
    uVar2 = TimeOut::operator_cast_to_unsigned_int((TimeOut *)tOut.tv_usec);
    uVar3 = TimeOut::operator_cast_to_unsigned_int((TimeOut *)&InstantCheck);
    if (uVar2 == uVar3) {
      iVar4 = pthread_mutex_trylock((pthread_mutex_t *)this);
      this_local._7_1_ = iVar4 == 0;
    }
    else {
      gettimeofday((timeval *)auStack_30,(__timezone_ptr_t)0x0);
      uVar2 = TimeOut::operator_cast_to_unsigned_int((TimeOut *)tOut.tv_usec);
      tOut.tv_sec = (ulong)(uVar2 * 1000) + tOut.tv_sec;
      if (1000000 < tOut.tv_sec) {
        _auStack_30 = _auStack_30 + 1;
        tOut.tv_sec = tOut.tv_sec + -1000000;
      }
      local_34 = -1;
      while ((bVar1 = stillBefore((timeval *)auStack_30), bVar1 &&
             (local_34 = pthread_mutex_trylock((pthread_mutex_t *)this), local_34 != 0))) {
        sched_yield();
      }
      if (local_34 == 0) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Threading::MutexLock::_Lock(const TimeOut & rcxTO) volatile
{
    if (rcxTO == Infinite)
    {
        // Either pthread_mutex_lock return EINVAL (not initialized), and then it is not going to change
        // as we are the initializer (simply returns false here)
        return pthread_mutex_lock((HMUTEX*)&mutex) == 0;
    }
    else if (rcxTO == InstantCheck)
    {
        return pthread_mutex_trylock((HMUTEX*)&mutex) == 0;
    }
    else
    {   // We need to pool here, sorry
        // Process the absolute time for timeout
        struct timeval tOut;
        gettimeofday(&tOut, NULL);
        tOut.tv_usec += (uint32)rcxTO * 1000;
        if (tOut.tv_usec > 1000000)
        { tOut.tv_sec ++; tOut.tv_usec -= 1000000;  }

        // First try to lock the mutex
        // Sadly, we must poll here
        int retval = -1;
        while (stillBefore(&tOut))
        {
            retval = pthread_mutex_trylock((HMUTEX*)&mutex);
            if (retval == 0) break;
            // We didn't get the mutex, so sleep a little (to avoid CPU intensive wait)
            sched_yield();
        }
        if (retval == 0)
        {   // We now have the mutex, so check the state
            return true;
        }
        return false;
    }
}